

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# FundamentalOperationalData.cpp
# Opt level: O0

void __thiscall
KDIS::DATA_TYPE::FundamentalOperationalData::Encode
          (FundamentalOperationalData *this,KDataStream *stream)

{
  KDataStream *pKVar1;
  KDataStream *stream_local;
  FundamentalOperationalData *this_local;
  
  pKVar1 = KDataStream::operator<<(stream,(this->field_0).field_0.m_ui8SystemStatus);
  pKVar1 = KDataStream::operator<<(pKVar1,(this->field_0).field_0.m_ui8AltParam4);
  pKVar1 = KDataStream::operator<<(pKVar1,(this->field_0).field_0.m_ui8InfoLayers);
  pKVar1 = KDataStream::operator<<(pKVar1,(this->field_0).field_0.m_ui8Modifier);
  pKVar1 = KDataStream::operator<<(pKVar1,(this->field_0).field_0.m_ui16Param1);
  pKVar1 = KDataStream::operator<<(pKVar1,(this->field_0).field_0.m_ui16Param2);
  pKVar1 = KDataStream::operator<<(pKVar1,(this->field_0).field_0.m_ui16Param3);
  pKVar1 = KDataStream::operator<<(pKVar1,(this->field_0).field_0.m_ui16Param4);
  pKVar1 = KDataStream::operator<<(pKVar1,(this->field_0).field_0.m_ui16Param5);
  KDataStream::operator<<(pKVar1,(this->field_0).field_0.m_ui16Param6);
  return;
}

Assistant:

void FundamentalOperationalData::Encode( KDataStream & stream ) const
{
    stream << m_ui8SystemStatus
           << m_ui8AltParam4
           << m_ui8InfoLayers
           << m_ui8Modifier
           << m_ui16Param1
           << m_ui16Param2
           << m_ui16Param3
           << m_ui16Param4
           << m_ui16Param5
           << m_ui16Param6;
}